

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormatLite::WriteEnumToArray
                    (int field_number,int value,uint8_t *target)

{
  uint8_t *puVar1;
  uint8_t *target_local;
  int value_local;
  int field_number_local;
  
  puVar1 = WriteTagToArray(field_number,WIRETYPE_VARINT,target);
  puVar1 = WriteEnumNoTagToArray(value,puVar1);
  return puVar1;
}

Assistant:

inline uint8_t* WireFormatLite::WriteEnumToArray(int field_number, int value,
                                                 uint8_t* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteEnumNoTagToArray(value, target);
}